

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC16NoTop_C(uint8_t *dst)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 8;
  for (lVar1 = -1; lVar1 != 0x1ff; lVar1 = lVar1 + 0x20) {
    uVar2 = uVar2 + dst[lVar1];
  }
  Put16(uVar2 >> 4,dst);
  return;
}

Assistant:

static void DC16NoTop_C(uint8_t* dst) {   // DC with top samples not available
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16(DC >> 4, dst);
}